

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v10::detail::digit_grouping<char>::apply<fmt::v10::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  size_type sVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  uint uVar10;
  int iVar11;
  undefined **local_828;
  undefined4 *local_820;
  ulong local_818;
  ulong local_810;
  undefined4 local_808 [502];
  
  uVar3 = digits.size_;
  puVar9 = local_808;
  local_828 = &PTR_grow_0013a9d8;
  local_810 = 500;
  local_818 = 1;
  local_808[0] = 0;
  sVar1 = (this->thousands_sep_)._M_string_length;
  uVar10 = (uint)digits.size_;
  local_820 = puVar9;
  if (sVar1 != 0) {
    pcVar6 = (this->grouping_)._M_dataplus._M_p;
    iVar11 = 0;
    do {
      pcVar5 = (this->grouping_)._M_dataplus._M_p + (this->grouping_)._M_string_length;
      if (pcVar6 == pcVar5) {
        cVar4 = pcVar5[-1];
      }
      else {
        cVar4 = *pcVar6;
        if ((byte)(cVar4 + 0x81U) < 0x82) goto LAB_0010f91d;
        pcVar6 = pcVar6 + 1;
      }
      iVar11 = iVar11 + cVar4;
      if ((iVar11 == 0) || ((int)uVar10 <= iVar11)) goto LAB_0010f91d;
      uVar7 = local_818 + 1;
      if (local_810 < uVar7) {
        (*(code *)*local_828)(&local_828,uVar7);
        uVar7 = local_818 + 1;
        sVar1 = (this->thousands_sep_)._M_string_length;
        puVar9 = local_820;
      }
      puVar9[local_818] = iVar11;
      local_818 = uVar7;
      if (sVar1 == 0) goto LAB_0010f91d;
    } while( true );
  }
  iVar11 = 0;
LAB_0010f925:
  if (0 < (int)uVar10) {
    uVar7 = 0;
    do {
      if ((int)uVar3 == local_820[iVar11]) {
        pcVar6 = (this->thousands_sep_)._M_dataplus._M_p;
        buffer<char>::append<char>
                  ((buffer<char> *)
                   out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,pcVar6,
                   pcVar6 + (this->thousands_sep_)._M_string_length);
        iVar11 = iVar11 + -1;
      }
      cVar4 = digits.data_[uVar7];
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar8 = lVar2 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar8) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar8 = lVar2 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar8;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar2) = cVar4;
      uVar7 = uVar7 + 1;
      uVar3 = (ulong)((int)uVar3 - 1);
      puVar9 = local_820;
    } while ((uVar10 & 0x7fffffff) != uVar7);
  }
  if (puVar9 != local_808) {
    operator_delete(puVar9);
  }
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
LAB_0010f91d:
  iVar11 = (int)local_818 + -1;
  goto LAB_0010f925;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out =
            copy_str<Char>(thousands_sep_.data(),
                           thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }